

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O2

int16_t aom_rb_read_signed_primitive_refsubexpfin
                  (aom_read_bit_buffer *rb,uint16_t n,uint16_t k,int16_t ref)

{
  short sVar1;
  ushort r;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  int iVar5;
  int iVar6;
  uint16_t uVar7;
  int iVar8;
  undefined4 local_38;
  
  r = (n + ref) - 1;
  uVar2 = (uint)(ushort)(n * 2 - 1);
  iVar5 = 0;
  iVar8 = 0;
  while( true ) {
    local_38 = (int)CONCAT62(in_register_00000012,k);
    iVar6 = (int)CONCAT62(in_register_00000012,k) + -1 + iVar8;
    if (iVar8 == 0) {
      iVar6 = local_38;
    }
    if ((int)uVar2 <= (3 << ((byte)iVar6 & 0x1f)) + iVar5) break;
    iVar3 = aom_rb_read_bit(rb);
    if (iVar3 == 0) {
      iVar8 = aom_rb_read_literal(rb,iVar6);
LAB_0015f1fd:
      uVar7 = (short)iVar8 + (short)iVar5;
      if (uVar2 < (uint)r * 2) {
        sVar1 = n * 2 + -2;
        uVar7 = inv_recenter_nonneg(sVar1 - r,uVar7);
        uVar7 = sVar1 - uVar7;
      }
      else {
        uVar7 = inv_recenter_nonneg(r,uVar7);
      }
      return (uVar7 - n) + 1;
    }
    iVar8 = iVar8 + 1;
    iVar5 = iVar5 + (1 << ((byte)iVar6 & 0x1f));
  }
  if ((ushort)(uVar2 - iVar5) < 2) {
    iVar8 = 0;
  }
  else {
    uVar4 = uVar2 - iVar5 & 0xffff;
    iVar8 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    iVar6 = (2 << ((byte)iVar8 & 0x1f)) - uVar4;
    iVar8 = aom_rb_read_literal(rb,iVar8);
    if (iVar6 <= iVar8) {
      iVar3 = aom_rb_read_bit(rb);
      iVar8 = (iVar8 * 2 - iVar6) + iVar3;
    }
  }
  goto LAB_0015f1fd;
}

Assistant:

int16_t aom_rb_read_signed_primitive_refsubexpfin(
    struct aom_read_bit_buffer *rb, uint16_t n, uint16_t k, int16_t ref) {
  ref += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  return aom_rb_read_primitive_refsubexpfin(rb, scaled_n, k, ref) - n + 1;
}